

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O2

FT_Hashnode * hash_bucket(FT_Hashkey key,FT_Hash hash)

{
  FT_Hashnode *ppFVar1;
  FT_Bool FVar2;
  FT_ULong FVar3;
  FT_Hashnode *ppFVar4;
  FT_Hashkey local_28;
  
  ppFVar1 = hash->table;
  local_28 = key;
  FVar3 = (*hash->lookup)(&local_28);
  ppFVar4 = ppFVar1 + FVar3 % (ulong)hash->size;
  while( true ) {
    if (&(*ppFVar4)->key == (FT_Hashkey *)0x0) {
      return ppFVar4;
    }
    FVar2 = (*hash->compare)(&(*ppFVar4)->key,&local_28);
    if (FVar2 != '\0') break;
    ppFVar4 = ppFVar4 + -1;
    if (ppFVar4 < ppFVar1) {
      ppFVar4 = ppFVar1 + (hash->size - 1);
    }
  }
  return ppFVar4;
}

Assistant:

static FT_Hashnode*
  hash_bucket( FT_Hashkey  key,
               FT_Hash     hash )
  {
    FT_ULong      res = 0;
    FT_Hashnode*  bp  = hash->table;
    FT_Hashnode*  ndp;


    res = (hash->lookup)( &key );

    ndp = bp + ( res % hash->size );
    while ( *ndp )
    {
      if ( (hash->compare)( &(*ndp)->key, &key ) )
        break;

      ndp--;
      if ( ndp < bp )
        ndp = bp + ( hash->size - 1 );
    }

    return ndp;
  }